

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# webpmux.c
# Opt level: O0

int ParseFrameArgs(char *args,WebPMuxFrameInfo *info)

{
  undefined4 uVar1;
  long in_RSI;
  undefined8 in_RDI;
  int num_args;
  char blend_method;
  char plus_minus;
  int unused;
  int dispose_method;
  char local_22;
  char local_21;
  undefined1 local_20 [4];
  undefined4 local_1c;
  long local_18;
  int local_4;
  
  local_18 = in_RSI;
  uVar1 = __isoc99_sscanf(in_RDI,"+%d+%d+%d+%d%c%c+%d",in_RSI + 0x18,in_RSI + 0x10,in_RSI + 0x14,
                          &local_1c,&local_21,&local_22,local_20);
  switch(uVar1) {
  case 1:
    *(undefined4 *)(local_18 + 0x14) = 0;
    *(undefined4 *)(local_18 + 0x10) = 0;
  case 3:
    local_1c = 0;
  case 4:
    local_21 = '+';
    local_22 = 'b';
  case 6:
    WarnAboutOddOffset((WebPMuxFrameInfo *)0x105277);
    *(undefined4 *)(local_18 + 0x20) = local_1c;
    if (local_22 == 'b') {
      if ((local_21 == '-') || (local_21 == '+')) {
        *(uint *)(local_18 + 0x24) = (uint)(local_21 != '+');
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
    break;
  case 2:
  case 5:
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int ParseFrameArgs(const char* args, WebPMuxFrameInfo* const info) {
  int dispose_method, unused;
  char plus_minus, blend_method;
  const int num_args = sscanf(args, "+%d+%d+%d+%d%c%c+%d", &info->duration,
                              &info->x_offset, &info->y_offset, &dispose_method,
                              &plus_minus, &blend_method, &unused);
  switch (num_args) {
    case 1:
      info->x_offset = info->y_offset = 0;  // fall through
    case 3:
      dispose_method = 0;  // fall through
    case 4:
      plus_minus = '+';
      blend_method = 'b';  // fall through
    case 6:
      break;
    case 2:
    case 5:
    default:
      return 0;
  }

  WarnAboutOddOffset(info);

  // Note: The validity of the following conversion is checked by
  // WebPMuxPushFrame().
  info->dispose_method = (WebPMuxAnimDispose)dispose_method;

  if (blend_method != 'b') return 0;
  if (plus_minus != '-' && plus_minus != '+') return 0;
  info->blend_method =
      (plus_minus == '+') ? WEBP_MUX_BLEND : WEBP_MUX_NO_BLEND;
  return 1;
}